

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

void __thiscall QWidgetTextControlPrivate::createAutoBulletList(QWidgetTextControlPrivate *this)

{
  long in_RDI;
  long in_FS_OFFSET;
  QTextListFormat listFmt;
  QTextBlockFormat blockFmt;
  QTextListFormat *this_00;
  Style astyle;
  QTextListFormat *this_01;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QTextCursor::beginEditBlock();
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  this_01 = (QTextListFormat *)&local_18;
  QTextCursor::blockFormat();
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = (QTextListFormat *)&local_28;
  QTextListFormat::QTextListFormat(this_00);
  astyle = (Style)((ulong)this_00 >> 0x20);
  QTextListFormat::setStyle(this_01,astyle);
  QTextBlockFormat::indent((QTextBlockFormat *)0x710523);
  QTextListFormat::setIndent(this_01,astyle);
  QTextBlockFormat::setIndent((QTextBlockFormat *)this_01,astyle);
  QTextCursor::setBlockFormat((QTextBlockFormat *)(in_RDI + 0x88));
  QTextCursor::createList((QTextListFormat *)(in_RDI + 0x88));
  QTextCursor::endEditBlock();
  QTextListFormat::~QTextListFormat((QTextListFormat *)0x71056c);
  QTextBlockFormat::~QTextBlockFormat((QTextBlockFormat *)0x710576);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControlPrivate::createAutoBulletList()
{
    cursor.beginEditBlock();

    QTextBlockFormat blockFmt = cursor.blockFormat();

    QTextListFormat listFmt;
    listFmt.setStyle(QTextListFormat::ListDisc);
    listFmt.setIndent(blockFmt.indent() + 1);

    blockFmt.setIndent(0);
    cursor.setBlockFormat(blockFmt);

    cursor.createList(listFmt);

    cursor.endEditBlock();
}